

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmtr.c
# Opt level: O0

pid_t dep_monitor(char *file)

{
  undefined8 uVar1;
  int __fd;
  int iVar2;
  __pid_t __pid;
  int *piVar3;
  char *pcVar4;
  char *local_190;
  ulong local_188;
  ulong local_170;
  char *local_160;
  char *local_158;
  job_t *local_150;
  ulong local_148;
  ulong local_130;
  job_t *local_120;
  job_t *local_118;
  job_t *local_108;
  ulong local_100;
  ulong local_e8;
  job_t *local_d8;
  job_t *local_d0;
  undefined1 local_c8 [8];
  sigset_t hup;
  char **dep;
  job_t *job;
  job_t *job_1;
  pid_t pid;
  int sc;
  int wd;
  int fd;
  int rc;
  char *file_local;
  
  file_local._4_4_ = fork();
  if (file_local._4_4_ == -1) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    syslog(3,"fork: %s\n",pcVar4);
    file_local._4_4_ = -1;
  }
  else if (file_local._4_4_ < 1) {
    prctl(0xf,"pmtr-dep");
    close_sockets(&cfg);
    __fd = inotify_init();
    if (__fd == -1) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      syslog(3,"inotify_init: %s",pcVar4);
      job = (job_t *)0x0;
      while( true ) {
        if (job == (job_t *)0x0) {
          if ((cfg.jobs)->i == 0) {
            local_d0 = (job_t *)0x0;
          }
          else {
            local_d0 = (job_t *)(cfg.jobs)->d;
          }
          local_d8 = local_d0;
        }
        else {
          if (job < (job_t *)(cfg.jobs)->d) {
            local_e8 = 0xffffffffffffffff;
          }
          else {
            local_e8 = (ulong)((long)job - (long)(cfg.jobs)->d) / ((cfg.jobs)->icd).sz;
          }
          if (local_e8 + 1 < (ulong)(cfg.jobs)->i) {
            if (job < (job_t *)(cfg.jobs)->d) {
              local_100 = 0xffffffffffffffff;
            }
            else {
              local_100 = (ulong)((long)job - (long)(cfg.jobs)->d) / ((cfg.jobs)->icd).sz;
            }
            local_108 = (job_t *)((cfg.jobs)->d + ((cfg.jobs)->icd).sz * (local_100 + 1));
          }
          else {
            local_108 = (job_t *)0x0;
          }
          local_d8 = local_108;
        }
        job = local_d8;
        if (local_d8 == (job_t *)0x0) break;
        if ((local_d8->disabled == 0) && ((local_d8->depv).i != 0)) {
          syslog(3,"job %s: dependency watching disabled",local_d8->name);
        }
      }
      exit(0x21);
    }
    iVar2 = inotify_add_watch(__fd,file,8);
    if (iVar2 != -1) {
      dep = (char **)0x0;
      while( true ) {
        if (dep == (char **)0x0) {
          if ((cfg.jobs)->i == 0) {
            local_118 = (job_t *)0x0;
          }
          else {
            local_118 = (job_t *)(cfg.jobs)->d;
          }
          local_120 = local_118;
        }
        else {
          if (dep < (cfg.jobs)->d) {
            local_130 = 0xffffffffffffffff;
          }
          else {
            local_130 = (ulong)((long)dep - (long)(cfg.jobs)->d) / ((cfg.jobs)->icd).sz;
          }
          if (local_130 + 1 < (ulong)(cfg.jobs)->i) {
            if (dep < (cfg.jobs)->d) {
              local_148 = 0xffffffffffffffff;
            }
            else {
              local_148 = (ulong)((long)dep - (long)(cfg.jobs)->d) / ((cfg.jobs)->icd).sz;
            }
            local_150 = (job_t *)((cfg.jobs)->d + ((cfg.jobs)->icd).sz * (local_148 + 1));
          }
          else {
            local_150 = (job_t *)0x0;
          }
          local_120 = local_150;
        }
        dep = &local_120->name;
        if (local_120 == (job_t *)0x0) break;
        if (local_120->disabled == 0) {
          hup.__val[0xf] = 0;
          while( true ) {
            if (hup.__val[0xf] == 0) {
              if ((local_120->depv).i == 0) {
                local_158 = (char *)0x0;
              }
              else {
                local_158 = (local_120->depv).d;
              }
              local_160 = local_158;
            }
            else {
              if (hup.__val[0xf] < (local_120->depv).d) {
                local_170 = 0xffffffffffffffff;
              }
              else {
                local_170 = (hup.__val[0xf] - (long)(local_120->depv).d) / (local_120->depv).icd.sz;
              }
              if (local_170 + 1 < (ulong)(local_120->depv).i) {
                if (hup.__val[0xf] < (local_120->depv).d) {
                  local_188 = 0xffffffffffffffff;
                }
                else {
                  local_188 = (hup.__val[0xf] - (long)(local_120->depv).d) /
                              (local_120->depv).icd.sz;
                }
                local_190 = (local_120->depv).d + (local_120->depv).icd.sz * (local_188 + 1);
              }
              else {
                local_190 = (char *)0x0;
              }
              local_160 = local_190;
            }
            hup.__val[0xf] = (unsigned_long)local_160;
            if (local_160 == (char *)0x0) break;
            pcVar4 = fpath(local_120,*(char **)local_160);
            iVar2 = inotify_add_watch(__fd,pcVar4,8);
            if (iVar2 == -1) {
              uVar1 = *(undefined8 *)hup.__val[0xf];
              piVar3 = __errno_location();
              pcVar4 = strerror(*piVar3);
              syslog(3,"can\'t watch %s: %s",uVar1,pcVar4);
            }
          }
        }
      }
      signal(1,(__sighandler_t)0x0);
      prctl(1);
      sigemptyset((sigset_t *)local_c8);
      sigaddset((sigset_t *)local_c8,1);
      sigprocmask(1,(sigset_t *)local_c8,(sigset_t *)0x0);
      read(__fd,&cfg.eb,0x1010);
      nanosleep((timespec *)&halfsec,(timespec *)0x0);
      __pid = getppid();
      kill(__pid,1);
      exit(0);
    }
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    syslog(3,"can\'t watch %s: %s",file,pcVar4);
    sleep(10);
    exit(-1);
  }
  return file_local._4_4_;
}

Assistant:

pid_t dep_monitor(char *file) {
  int rc, fd, wd, sc;
  pid_t pid;

  pid = fork();

  if (pid == (pid_t)-1) {
    syslog(LOG_ERR, "fork: %s\n", strerror(errno));
    return (pid_t)-1;
  }

  if (pid > 0) return pid;

  /* child here */
  prctl(PR_SET_NAME, "pmtr-dep");
  close_sockets(&cfg);

  /* This sub-process monitors pmtr.conf for changes, and also any
   * files explicitly named by the "depends" keyword. It is based on
   * inotify in Linux. In some situations, inotify is not available,
   * e.g., in a Linux container on a Mac host that mounts a host folder.
   * Log if inotify initialization fails but treat this as non-fatal. */
  fd = inotify_init();
  if (fd == -1) {
    syslog(LOG_ERR, "inotify_init: %s", strerror(errno)); 
    job_t *job=NULL;
    while ( (job=(job_t*)utarray_next(cfg.jobs,job))) {
      if (job->disabled) continue;
      if (utarray_len(&job->depv) > 0) {
        syslog(LOG_ERR, "job %s: dependency watching disabled", job->name);
      }
    }
    exit(PMTR_NO_RESTART); /* don't restart the dep_monitor process */
  }

  wd = inotify_add_watch(fd, file, IN_CLOSE_WRITE);
  if (wd == -1) {
    syslog(LOG_ERR, "can't watch %s: %s", file, strerror(errno)); 
    sleep(SHORT_DELAY);  /* pmtr.conf unlinked pending rewrite? */
    exit(-1);            /* parent will restart us to try again */
  }

  /* loop over jobs' dependencies, adding watch on each one. if one
   * is missing, we log the error but not fatally, because parent
   * detects this situation and disables the job */
  job_t *job=NULL;
  while ( (job=(job_t*)utarray_next(cfg.jobs,job))) {
    if (job->disabled) continue;
    char **dep=NULL;
    while ( (dep=(char**)utarray_next(&job->depv,dep))) {
      sc = inotify_add_watch(fd, fpath(job,*dep), IN_CLOSE_WRITE);
      if (sc == -1) syslog(LOG_ERR,"can't watch %s: %s", *dep, strerror(errno));
    }
  }

  /* request HUP if parent exits, unblock, action terminate */
  signal(SIGHUP, SIG_DFL);
  prctl(PR_SET_PDEATHSIG, SIGHUP);
  sigset_t hup; sigemptyset(&hup); sigaddset(&hup,SIGHUP);
  sigprocmask(SIG_UNBLOCK,&hup,NULL);

  /* block for any inotify event. when one happens, notify parent */
  rc = read(fd, &cfg.eb, sizeof(cfg.eb));
  nanosleep(&halfsec,NULL);
  kill(getppid(), SIGHUP);
  exit(0);
}